

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

void __thiscall tf::TaskQueue<tf::Node_*>::Array::Array(Array *this,int64_t c)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  size_t size;
  atomic<tf::Node_*> *paVar3;
  atomic<tf::Node_*> *local_38;
  int64_t c_local;
  Array *this_local;
  
  this->C = c;
  this->M = c + -1;
  uVar1 = this->C;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  size = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    size = 0xffffffffffffffff;
  }
  paVar3 = (atomic<tf::Node_*> *)operator_new__(size);
  if (uVar1 != 0) {
    local_38 = paVar3;
    do {
      std::atomic<tf::Node_*>::atomic(local_38);
      local_38 = local_38 + 1;
    } while (local_38 != paVar3 + uVar1);
  }
  this->S = paVar3;
  return;
}

Assistant:

explicit Array(int64_t c) :
      C {c},
      M {c-1},
      S {new std::atomic<T>[static_cast<size_t>(C)]} {
    }